

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_WriteTimingInfo(FILE *pFile,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Time_t *pAVar2;
  Abc_Time_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Time_t *pAVar5;
  char *pcVar6;
  int local_3c;
  int i;
  Abc_Time_t *pTimeDefOut;
  Abc_Time_t *pTimeDefIn;
  Abc_Time_t *pTime;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    fprintf((FILE *)pFile,"\n");
    if ((pNtk->AndGateDelay != 0.0) || (NAN(pNtk->AndGateDelay))) {
      fprintf((FILE *)pFile,".and_gate_delay %g\n",(double)pNtk->AndGateDelay);
    }
    pAVar2 = Abc_NtkReadDefaultArrival(pNtk);
    fprintf((FILE *)pFile,".default_input_arrival %g %g\n",(double)pAVar2->Rise,(double)pAVar2->Fall
           );
    pAVar3 = Abc_NtkReadDefaultRequired(pNtk);
    fprintf((FILE *)pFile,".default_output_required %g %g\n",(double)pAVar3->Rise);
    fprintf((FILE *)pFile,"\n");
    for (local_3c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar4 = Abc_NtkPi(pNtk,local_3c);
      pAVar5 = Abc_NodeReadArrival(pAVar4);
      if ((((pAVar5->Rise != pAVar2->Rise) || (NAN(pAVar5->Rise) || NAN(pAVar2->Rise))) ||
          (pAVar5->Fall != pAVar2->Fall)) || (NAN(pAVar5->Fall) || NAN(pAVar2->Fall))) {
        pAVar4 = Abc_ObjFanout0(pAVar4);
        pcVar6 = Abc_ObjName(pAVar4);
        fprintf((FILE *)pFile,".input_arrival %s %g %g\n",(double)pAVar5->Rise,pcVar6);
      }
    }
    for (local_3c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar4 = Abc_NtkPo(pNtk,local_3c);
      pAVar2 = Abc_NodeReadRequired(pAVar4);
      if (((pAVar2->Rise != pAVar3->Rise) || (NAN(pAVar2->Rise) || NAN(pAVar3->Rise))) ||
         ((pAVar2->Fall != pAVar3->Fall || (NAN(pAVar2->Fall) || NAN(pAVar3->Fall))))) {
        pAVar4 = Abc_ObjFanin0(pAVar4);
        pcVar6 = Abc_ObjName(pAVar4);
        fprintf((FILE *)pFile,".output_required %s %g %g\n",(double)pAVar2->Rise,pcVar6);
      }
    }
    fprintf((FILE *)pFile,"\n");
    pAVar2 = Abc_NtkReadDefaultInputDrive(pNtk);
    if (((pAVar2->Rise != 0.0) || (NAN(pAVar2->Rise))) ||
       ((pAVar2->Fall != 0.0 || (NAN(pAVar2->Fall))))) {
      fprintf((FILE *)pFile,".default_input_drive %g %g\n",(double)pAVar2->Rise);
    }
    pAVar3 = Abc_NodeReadInputDrive(pNtk,0);
    if (pAVar3 != (Abc_Time_t *)0x0) {
      for (local_3c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
        pAVar4 = Abc_NtkPi(pNtk,local_3c);
        pAVar3 = Abc_NodeReadInputDrive(pNtk,local_3c);
        if ((((pAVar3->Rise != pAVar2->Rise) || (NAN(pAVar3->Rise) || NAN(pAVar2->Rise))) ||
            (pAVar3->Fall != pAVar2->Fall)) || (NAN(pAVar3->Fall) || NAN(pAVar2->Fall))) {
          pAVar4 = Abc_ObjFanout0(pAVar4);
          pcVar6 = Abc_ObjName(pAVar4);
          fprintf((FILE *)pFile,".input_drive %s %g %g\n",(double)pAVar3->Rise,pcVar6);
        }
      }
    }
    pAVar2 = Abc_NtkReadDefaultOutputLoad(pNtk);
    if (((pAVar2->Rise != 0.0) || (NAN(pAVar2->Rise))) ||
       ((pAVar2->Fall != 0.0 || (NAN(pAVar2->Fall))))) {
      fprintf((FILE *)pFile,".default_output_load %g %g\n",(double)pAVar2->Rise,(double)pAVar2->Fall
             );
    }
    pAVar3 = Abc_NodeReadOutputLoad(pNtk,0);
    if (pAVar3 != (Abc_Time_t *)0x0) {
      for (local_3c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
        pAVar4 = Abc_NtkPo(pNtk,local_3c);
        pAVar3 = Abc_NodeReadOutputLoad(pNtk,local_3c);
        if (((pAVar3->Rise != pAVar2->Rise) || (NAN(pAVar3->Rise) || NAN(pAVar2->Rise))) ||
           ((pAVar3->Fall != pAVar2->Fall || (NAN(pAVar3->Fall) || NAN(pAVar2->Fall))))) {
          pAVar4 = Abc_ObjFanin0(pAVar4);
          pcVar6 = Abc_ObjName(pAVar4);
          fprintf((FILE *)pFile,".output_load %s %g %g\n",(double)pAVar3->Rise,(double)pAVar3->Fall,
                  pcVar6);
        }
      }
    }
    fprintf((FILE *)pFile,"\n");
  }
  return;
}

Assistant:

void Io_WriteTimingInfo( FILE * pFile, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    Abc_Time_t * pTime, * pTimeDefIn, * pTimeDefOut;
    int i;

    if ( pNtk->pManTime == NULL )
        return;

    fprintf( pFile, "\n" );
    if ( pNtk->AndGateDelay != 0.0 )
        fprintf( pFile, ".and_gate_delay %g\n", pNtk->AndGateDelay );
    pTimeDefIn = Abc_NtkReadDefaultArrival( pNtk );
    //if ( pTimeDefIn->Rise != 0.0 || pTimeDefIn->Fall != 0.0 )
        fprintf( pFile, ".default_input_arrival %g %g\n", pTimeDefIn->Rise, pTimeDefIn->Fall );
    pTimeDefOut = Abc_NtkReadDefaultRequired( pNtk );
    //if ( pTimeDefOut->Rise != ABC_INFINITY || pTimeDefOut->Fall != ABC_INFINITY )
        fprintf( pFile, ".default_output_required %g %g\n", pTimeDefOut->Rise, pTimeDefOut->Fall );

    fprintf( pFile, "\n" );
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pTime = Abc_NodeReadArrival(pNode);
        if ( pTime->Rise == pTimeDefIn->Rise && pTime->Fall == pTimeDefIn->Fall )
            continue;
        fprintf( pFile, ".input_arrival %s %g %g\n", Abc_ObjName(Abc_ObjFanout0(pNode)), pTime->Rise, pTime->Fall );
    }
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pTime = Abc_NodeReadRequired(pNode);
        if ( pTime->Rise == pTimeDefOut->Rise && pTime->Fall == pTimeDefOut->Fall )
            continue;
        fprintf( pFile, ".output_required %s %g %g\n", Abc_ObjName(Abc_ObjFanin0(pNode)), pTime->Rise, pTime->Fall );
    }

    fprintf( pFile, "\n" );
    pTimeDefIn = Abc_NtkReadDefaultInputDrive( pNtk );
    if ( pTimeDefIn->Rise != 0.0 || pTimeDefIn->Fall != 0.0 )
        fprintf( pFile, ".default_input_drive %g %g\n", pTimeDefIn->Rise, pTimeDefIn->Fall );
    if ( Abc_NodeReadInputDrive( pNtk, 0 ) )
        Abc_NtkForEachPi( pNtk, pNode, i )
        {
            pTime = Abc_NodeReadInputDrive( pNtk, i );
            if ( pTime->Rise == pTimeDefIn->Rise && pTime->Fall == pTimeDefIn->Fall )
                continue;
            fprintf( pFile, ".input_drive %s %g %g\n", Abc_ObjName(Abc_ObjFanout0(pNode)), pTime->Rise, pTime->Fall );
        }

    pTimeDefOut = Abc_NtkReadDefaultOutputLoad( pNtk );
    if ( pTimeDefOut->Rise != 0.0 || pTimeDefOut->Fall != 0.0 )
        fprintf( pFile, ".default_output_load %g %g\n", pTimeDefOut->Rise, pTimeDefOut->Fall );
    if ( Abc_NodeReadOutputLoad( pNtk, 0 ) )
        Abc_NtkForEachPo( pNtk, pNode, i )
        {
            pTime = Abc_NodeReadOutputLoad( pNtk, i );
            if ( pTime->Rise == pTimeDefOut->Rise && pTime->Fall == pTimeDefOut->Fall )
                continue;
            fprintf( pFile, ".output_load %s %g %g\n", Abc_ObjName(Abc_ObjFanin0(pNode)), pTime->Rise, pTime->Fall );
        }

    fprintf( pFile, "\n" );
}